

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

Address CreateAddress(string *ip,int port)

{
  Address AVar1;
  sockaddr_in address;
  undefined1 auStack_1c [12];
  
  inet_pton(2,(ip->_M_dataplus)._M_p,auStack_1c);
  AVar1.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  AVar1.sin_family = 2;
  AVar1.sin_addr.s_addr = auStack_1c._0_4_;
  AVar1.sin_zero[0] = auStack_1c[4];
  AVar1.sin_zero[1] = auStack_1c[5];
  AVar1.sin_zero[2] = auStack_1c[6];
  AVar1.sin_zero[3] = auStack_1c[7];
  AVar1.sin_zero[4] = auStack_1c[8];
  AVar1.sin_zero[5] = auStack_1c[9];
  AVar1.sin_zero[6] = auStack_1c[10];
  AVar1.sin_zero[7] = auStack_1c[0xb];
  return AVar1;
}

Assistant:

Address CreateAddress(std::string ip, int port){
    struct sockaddr_in address;

    address.sin_family = AF_INET;
    //address.sin_addr.s_addr = inet_addr(ip.c_str());
    inet_pton(AF_INET, ip.c_str(), &address.sin_addr);
    address.sin_port = htons(port);

    return address;
}